

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_calculation.cc
# Opt level: O0

bool __thiscall
sptk::EntropyCalculation::Run
          (EntropyCalculation *this,vector<double,_std::allocator<double>_> *probability,
          double *entropy)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  double *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  double dVar4;
  int i_2;
  int i_1;
  int i;
  double sum;
  double *p;
  double in_stack_ffffffffffffffa0;
  double dVar5;
  int local_3c;
  int local_38;
  int local_34;
  double local_30;
  bool local_1;
  
  if ((((*(byte *)(in_RDI + 0x10) & 1) == 0) ||
      (sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
      sVar2 != (long)*(int *)(in_RDI + 8))) || (in_RDX == (double *)0x0)) {
    local_1 = false;
  }
  else {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
    local_30 = 0.0;
    iVar1 = *(int *)(in_RDI + 0xc);
    if (iVar1 == 0) {
      for (local_34 = 0; local_34 < *(int *)(in_RDI + 8); local_34 = local_34 + 1) {
        dVar5 = pvVar3[local_34];
        dVar4 = FloorLog2(in_stack_ffffffffffffffa0);
        local_30 = dVar5 * dVar4 + local_30;
      }
    }
    else if (iVar1 == 1) {
      for (local_38 = 0; local_38 < *(int *)(in_RDI + 8); local_38 = local_38 + 1) {
        dVar5 = pvVar3[local_38];
        dVar4 = FloorLog(dVar5);
        local_30 = dVar5 * dVar4 + local_30;
      }
    }
    else {
      if (iVar1 != 2) {
        return false;
      }
      for (local_3c = 0; local_3c < *(int *)(in_RDI + 8); local_3c = local_3c + 1) {
        dVar5 = pvVar3[local_3c];
        dVar4 = FloorLog10(in_stack_ffffffffffffffa0);
        local_30 = dVar5 * dVar4 + local_30;
      }
    }
    *in_RDX = -local_30;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool EntropyCalculation::Run(const std::vector<double>& probability,
                             double* entropy) const {
  if (!is_valid_ ||
      probability.size() != static_cast<std::size_t>(num_element_) ||
      NULL == entropy) {
    return false;
  }

  const double* p(&(probability[0]));
  double sum(0.0);

  switch (entropy_unit_) {
    case kBit: {
      for (int i(0); i < num_element_; ++i) {
        sum += p[i] * FloorLog2(p[i]);
      }
      break;
    }
    case kNat: {
      for (int i(0); i < num_element_; ++i) {
        sum += p[i] * FloorLog(p[i]);
      }
      break;
    }
    case kDit: {
      for (int i(0); i < num_element_; ++i) {
        sum += p[i] * FloorLog10(p[i]);
      }
      break;
    }
    default: {
      return false;
    }
  }

  *entropy = -sum;

  return true;
}